

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O3

void __thiscall acto::core::worker_t::execute(worker_t *this)

{
  bool bVar1;
  worker_t *in_RSI;
  
  while( true ) {
    event::wait(&this->wakeup_event_,in_RSI);
    if (((this->active_)._M_base._M_i & 1U) == 0) break;
    bVar1 = process(this);
    if (!bVar1) {
      in_RSI = this;
      (*this->slots_->_vptr_callbacks[4])();
    }
  }
  return;
}

Assistant:

void worker_t::execute() {
  while (true) {
    wakeup_event_.wait(); // Cond: (object_ != 0) || (active_ == false)
    if (!active_) {
      return;
    }
    if (!process()) {
      slots_->push_idle(this);
    }
  }
}